

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderView::initStyleOption(QHeaderView *this,QStyleOptionHeader *option)

{
  Orientation OVar1;
  long lVar2;
  Int IVar3;
  
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 2;
  OVar1 = *(Orientation *)(lVar2 + 0x548);
  option->orientation = OVar1;
  IVar3 = 3;
  if (OVar1 == Horizontal) {
    (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = 0x82;
    IVar3 = 0x83;
  }
  if ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)->
       widget_attributes & 1) == 0) {
    (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = IVar3;
  }
  option->section = 0;
  return;
}

Assistant:

void QHeaderView::initStyleOption(QStyleOptionHeader *option) const
{
    Q_D(const QHeaderView);
    option->initFrom(this);
    option->state = QStyle::State_None | QStyle::State_Raised;
    option->orientation = d->orientation;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    option->section = 0;
}